

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void celero::executor::RunExperiments(shared_ptr<celero::Benchmark> *bmark)

{
  Benchmark *this;
  size_t sVar1;
  size_t sVar2;
  shared_ptr<celero::Experiment> e;
  __shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this = (bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this != (Benchmark *)0x0) {
    sVar1 = Benchmark::getExperimentSize(this);
    for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
      Benchmark::getExperiment
                ((Benchmark *)&local_50,
                 (size_t)(bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      if (local_50._M_ptr == (element_type *)0x0) {
        __assert_fail("e != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/Executor.cpp"
                      ,0x119,"void celero::executor::RunExperiments(std::shared_ptr<Benchmark>)");
      }
      std::__shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&local_50);
      Run((shared_ptr<celero::Experiment> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    }
  }
  return;
}

Assistant:

void executor::RunExperiments(std::shared_ptr<Benchmark> bmark)
{
	if(bmark == nullptr)
	{
		return;
	}

	const auto experimentSize = bmark->getExperimentSize();

	for(size_t i = 0; i < experimentSize; i++)
	{
		auto e = bmark->getExperiment(i);
		assert(e != nullptr);

		executor::Run(e);
	}
}